

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::optimizeTernary<wasm::If>(OptimizeInstructions *this,If *curr)

{
  element_type *peVar1;
  pointer *ppppEVar2;
  UnaryOp UVar3;
  Type type;
  uintptr_t uVar4;
  Expression *pEVar5;
  uintptr_t uVar6;
  bool bVar7;
  pointer pppEVar8;
  bool bVar9;
  UnaryOp UVar10;
  Index IVar11;
  int64_t iVar12;
  ulong uVar13;
  Expression **ppEVar14;
  Expression *pEVar15;
  Expression ***pppEVar16;
  Const **ppCVar17;
  Expression *pEVar18;
  Literal *__return_storage_ptr__;
  bool bVar19;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  undefined1 local_128 [8];
  ChildIterator ifFalseChildren;
  Const *c;
  void *local_c0;
  long local_b0;
  undefined1 local_a8 [8];
  SmallVector<wasm::Expression_*,_1UL> chain;
  undefined1 local_78 [8];
  ChildIterator ifTrueChildren;
  Expression *reuse;
  
  chain.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 1) &&
      (pEVar18 = curr->ifTrue, (pEVar18->type).id != 1)) &&
     (pEVar15 = curr->ifFalse, (pEVar15->type).id != 1)) {
    peVar1 = (element_type *)
             ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                     flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data + 0x10);
    ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[0] =
         (Expression **)0x0;
    ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[2] =
         (Expression **)0x0;
    if (pEVar15->_id == ConstId) {
      ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pEVar15;
      local_78 = (undefined1  [8])peVar1;
      Literal::Literal((Literal *)local_128,(Literal *)(pEVar15 + 1));
      bVar9 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
              ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
                         *)&ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children
                            .fixed,(Literal *)local_128);
      Literal::~Literal((Literal *)local_128);
      if ((bVar9) && (pEVar18->_id == UnaryId)) {
        UVar3 = *(UnaryOp *)(pEVar18 + 1);
        __return_storage_ptr__ = (Literal *)0x13;
        UVar10 = Match::Internal::AbstractUnaryOpK::getOp
                           ((Type)*(uintptr_t *)(pEVar18[1].type.id + 8),EqZ);
        if (UVar3 == UVar10) goto LAB_009ce0c1;
      }
    }
    pEVar15 = curr->ifTrue;
    pEVar18 = curr->ifFalse;
    ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[0] =
         (Expression **)0x0;
    ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[2] =
         (Expression **)0x0;
    local_78 = (undefined1  [8])peVar1;
    if (pEVar15->_id == ConstId) {
      ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pEVar15;
      Literal::Literal((Literal *)local_128,(Literal *)(pEVar15 + 1));
      bVar9 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
              ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
                         *)&ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children
                            .fixed,(Literal *)local_128);
      Literal::~Literal((Literal *)local_128);
      if ((bVar9) && (pEVar18->_id == UnaryId)) {
        UVar3 = *(UnaryOp *)(pEVar18 + 1);
        __return_storage_ptr__ = (Literal *)0x13;
        UVar10 = Match::Internal::AbstractUnaryOpK::getOp
                           ((Type)*(uintptr_t *)(pEVar18[1].type.id + 8),EqZ);
        if (UVar3 == UVar10) {
LAB_009ce0c1:
          pEVar15 = (Expression *)pEVar18[1].type.id;
          type.id = (pEVar15->type).id;
          if (pEVar18 != curr->ifTrue) {
            iVar12 = Literal::getInteger((Literal *)
                                         (ifFalseChildren.
                                          super_AbstractChildIterator<wasm::ChildIterator>.children.
                                          flexible.
                                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
            __return_storage_ptr__ = (Literal *)local_78;
            Literal::makeFromInt32(__return_storage_ptr__,1 - (int)iVar12,type);
            Literal::operator=((Literal *)
                               (ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                                children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                               __return_storage_ptr__);
            Literal::~Literal((Literal *)local_78);
            ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[1] = (Expression **)type.id;
            pEVar15 = (Expression *)
                      ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                      flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          curr->ifTrue = pEVar15;
          if (pEVar18 == curr->ifFalse) {
            pEVar15 = (Expression *)pEVar18[1].type.id;
          }
          else {
            iVar12 = Literal::getInteger((Literal *)
                                         (ifFalseChildren.
                                          super_AbstractChildIterator<wasm::ChildIterator>.children.
                                          flexible.
                                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
            __return_storage_ptr__ = (Literal *)local_78;
            Literal::makeFromInt32(__return_storage_ptr__,1 - (int)iVar12,type);
            Literal::operator=((Literal *)
                               (ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                                children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                               __return_storage_ptr__);
            Literal::~Literal((Literal *)local_78);
            ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[1] = (Expression **)type.id;
            pEVar15 = (Expression *)
                      ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                      flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          curr->ifFalse = pEVar15;
          pEVar18[1].type.id = (uintptr_t)curr;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)__return_storage_ptr__;
          If::finalize(curr,type__00);
          replaceCurrent((OptimizeInstructions *)
                         chain.flexible.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar18);
          return;
        }
      }
    }
  }
  local_a8 = (undefined1  [8])0x0;
  chain.fixed._M_elems[0] = (_Type)(Expression *)0x0;
  chain.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  chain.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    uVar13 = (ulong)curr->ifTrue->_id;
    if (((uVar13 < 0x36) && ((0x3000000000000eU >> (uVar13 & 0x3f) & 1) != 0)) ||
       (bVar9 = ExpressionAnalyzer::shallowEqual(curr->ifTrue,curr->ifFalse), !bVar9)) break;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_78,curr->ifTrue);
    if ((long)(((Literals *)((long)local_78 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
              _M_elems +
        ((long)ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_start -
         (long)ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
               _M_elems[3] >> 3) + -0x10 == 1) {
      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                ((AbstractChildIterator<wasm::ChildIterator> *)local_128,curr->ifFalse);
      IVar11 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                         ((AbstractChildIterator<wasm::ChildIterator> *)local_78,0);
      pppEVar16 = (Expression ***)
                  (ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                   _M_elems[3] + ((ulong)IVar11 - 4));
      if (IVar11 < 4) {
        pppEVar16 = ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems + ((ulong)IVar11 - 1);
      }
      pEVar18 = **pppEVar16;
      IVar11 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                         ((AbstractChildIterator<wasm::ChildIterator> *)local_128,0);
      pppEVar16 = (Expression ***)
                  (ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                   _M_elems[3] + ((ulong)IVar11 - 4));
      if (IVar11 < 4) {
        pppEVar16 = ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems + ((ulong)IVar11 - 1);
      }
      pEVar15 = curr->ifFalse;
      uVar4 = (curr->ifTrue->type).id;
      if (uVar4 != (pEVar15->type).id) {
        __assert_fail("curr->ifTrue->type == curr->ifFalse->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x15cb,"void wasm::OptimizeInstructions::optimizeTernary(T *) [T = wasm::If]"
                     );
      }
      pEVar5 = **pppEVar16;
      uVar6 = (pEVar5->type).id;
      bVar19 = (pEVar18->type).id == uVar6;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload._1_7_ = (undefined7)(uVar6 >> 8);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ = bVar19;
      bVar9 = ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id !=
              1) == (uVar4 == 1);
      bVar7 = false;
      if (!bVar9 && bVar19) {
        curr->ifTrue = pEVar18;
        curr->ifFalse = pEVar5;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pEVar15;
        If::finalize(curr,type_);
        ppppEVar2 = (pointer *)
                    ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                            children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data + 0x10);
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                  ((AbstractChildIterator<wasm::ChildIterator> *)ppppEVar2,
                   (Expression *)
                   ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible
                   .super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        IVar11 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                           ((AbstractChildIterator<wasm::ChildIterator> *)ppppEVar2,0);
        ppCVar17 = (Const **)((long)local_c0 + (ulong)IVar11 * 8 + -0x20);
        if (IVar11 < 4) {
          ppCVar17 = &c + IVar11;
        }
        *(If **)&((*ppCVar17)->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression
             = curr;
        if (local_c0 != (void *)0x0) {
          operator_delete(local_c0,local_b0 - (long)local_c0);
        }
        pppEVar8 = ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible
                   .super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (((long)chain.flexible.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start - (long)chain.fixed._M_elems[0] >> 3) +
            (long)local_a8 != 0) {
          ppEVar14 = SmallVector<wasm::Expression_*,_1UL>::back
                               ((SmallVector<wasm::Expression_*,_1UL> *)local_a8);
          ppppEVar2 = (pointer *)
                      ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                              children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data + 0x10);
          AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                    ((AbstractChildIterator<wasm::ChildIterator> *)ppppEVar2,*ppEVar14);
          IVar11 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                             ((AbstractChildIterator<wasm::ChildIterator> *)ppppEVar2,0);
          ppCVar17 = (Const **)((long)local_c0 + (ulong)IVar11 * 8 + -0x20);
          if (IVar11 < 4) {
            ppCVar17 = &c + IVar11;
          }
          *(pointer *)
           &((*ppCVar17)->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression =
               pppEVar8;
          if (local_c0 != (void *)0x0) {
            operator_delete(local_c0,local_b0 - (long)local_c0);
          }
        }
        SmallVector<wasm::Expression_*,_1UL>::push_back
                  ((SmallVector<wasm::Expression_*,_1UL> *)local_a8,
                   (Expression **)
                   ((long)&ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                           flexible.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data + 0x10));
        bVar7 = true;
      }
      if (ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
          [3] != (Expression **)0x0) {
        operator_delete(ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                        fixed._M_elems[3],
                        (long)ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                              children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                              children.fixed._M_elems[3]);
      }
      if (bVar9 || !bVar19) goto LAB_009ce3d9;
    }
    else {
LAB_009ce3d9:
      bVar7 = false;
    }
    if (ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3]
        != (Expression **)0x0) {
      operator_delete(ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed
                      ._M_elems[3],
                      (long)ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children
                            .flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children
                            .fixed._M_elems[3]);
    }
  } while (bVar7);
  if (((long)chain.flexible.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start - (long)chain.fixed._M_elems[0] >> 3) + (long)local_a8
      != 0) {
    replaceCurrent((OptimizeInstructions *)
                   chain.flexible.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(Expression *)chain.usedFixed);
  }
  if (chain.fixed._M_elems[0] != (Expression *)0x0) {
    operator_delete((void *)chain.fixed._M_elems[0],
                    (long)chain.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)chain.fixed._M_elems[0]
                   );
  }
  return;
}

Assistant:

void optimizeTernary(T* curr) {
    using namespace Abstract;
    using namespace Match;
    Builder builder(*getModule());

    // If one arm is an operation and the other is an appropriate constant, we
    // can move the operation outside (where it may be further optimized), e.g.
    //
    //  (select
    //    (i32.eqz (X))
    //    (i32.const 0|1)
    //    (Y)
    //  )
    // =>
    //  (i32.eqz
    //    (select
    //      (X)
    //      (i32.const 1|0)
    //      (Y)
    //    )
    //  )
    //
    // Ignore unreachable code here; leave that for DCE.
    if (curr->type != Type::unreachable &&
        curr->ifTrue->type != Type::unreachable &&
        curr->ifFalse->type != Type::unreachable) {
      Unary* un;
      Const* c;
      auto check = [&](Expression* a, Expression* b) {
        return matches(b, bval(&c)) && matches(a, unary(&un, EqZ, any()));
      };
      if (check(curr->ifTrue, curr->ifFalse) ||
          check(curr->ifFalse, curr->ifTrue)) {
        // The new type of curr will be that of the value of the unary, as after
        // we move the unary out, its value is curr's direct child.
        auto newType = un->value->type;
        auto updateArm = [&](Expression* arm) -> Expression* {
          if (arm == un) {
            // This is the arm that had the eqz, which we need to remove.
            return un->value;
          } else {
            // This is the arm with the constant, which we need to flip.
            // Note that we also need to set the type to match the other arm.
            c->value =
              Literal::makeFromInt32(1 - c->value.getInteger(), newType);
            c->type = newType;
            return c;
          }
        };
        curr->ifTrue = updateArm(curr->ifTrue);
        curr->ifFalse = updateArm(curr->ifFalse);
        un->value = curr;
        curr->finalize();
        return replaceCurrent(un);
      }
    }

    {
      // Identical code on both arms can be folded out, e.g.
      //
      //  (select
      //    (i32.eqz (X))
      //    (i32.eqz (Y))
      //    (Z)
      //  )
      // =>
      //  (i32.eqz
      //    (select
      //      (X)
      //      (Y)
      //      (Z)
      //    )
      //  )
      //
      // Continue doing this while we can, noting the chain of moved expressions
      // as we go, then do a single replaceCurrent() at the end.
      SmallVector<Expression*, 1> chain;
      while (1) {
        // Ignore control flow structures (which are handled in MergeBlocks).
        if (!Properties::isControlFlowStructure(curr->ifTrue) &&
            ExpressionAnalyzer::shallowEqual(curr->ifTrue, curr->ifFalse)) {
          // TODO: consider the case with more than one child.
          ChildIterator ifTrueChildren(curr->ifTrue);
          if (ifTrueChildren.children.size() == 1) {
            // ifTrue and ifFalse's children will become the direct children of
            // curr, and so they must be compatible to allow for a proper new
            // type after the transformation.
            //
            // At minimum an LUB is required, as shown here:
            //
            //  (if
            //    (condition)
            //    (drop (i32.const 1))
            //    (drop (f64.const 2.0))
            //  )
            //
            // However, that may not be enough, as with nominal types we can
            // have things like this:
            //
            //  (if
            //    (condition)
            //    (struct.get $A 1 (..))
            //    (struct.get $B 1 (..))
            //  )
            //
            // It is possible that the LUB of $A and $B does not contain field
            // "1". With structural types this specific problem is not possible,
            // and it appears to be the case that with the GC MVP there is no
            // instruction that poses a problem, but in principle it can happen
            // there as well, if we add an instruction that returns the number
            // of fields in a type, for example. For that reason, and to avoid
            // a difference between structural and nominal typing here, disallow
            // subtyping in both. (Note: In that example, the problem only
            // happens because the type is not part of the struct.get - we infer
            // it from the reference. That is why after hoisting the struct.get
            // out, and computing a new type for the if that is now the child of
            // the single struct.get, we get a struct.get of a supertype. So in
            // principle we could fix this by modifying the IR as well, but the
            // problem is more general, so avoid that.)
            ChildIterator ifFalseChildren(curr->ifFalse);
            auto* ifTrueChild = *ifTrueChildren.begin();
            auto* ifFalseChild = *ifFalseChildren.begin();
            bool validTypes = ifTrueChild->type == ifFalseChild->type;

            // In addition, after we move code outside of curr then we need to
            // not change unreachability - if we did, we'd need to propagate
            // that further, and we leave such work to DCE and Vacuum anyhow.
            // This can happen in something like this for example, where the
            // outer type changes from i32 to unreachable if we move the
            // returns outside:
            //
            //  (if (result i32)
            //    (local.get $x)
            //    (return
            //      (local.get $y)
            //    )
            //    (return
            //      (local.get $z)
            //    )
            //  )
            assert(curr->ifTrue->type == curr->ifFalse->type);
            auto newOuterType = curr->ifTrue->type;
            if ((newOuterType == Type::unreachable) !=
                (curr->type == Type::unreachable)) {
              validTypes = false;
            }

            // If the expression we are about to move outside has side effects,
            // then we cannot do so in general with a select: we'd be reducing
            // the amount of the effects as well as moving them. For an if,
            // the side effects execute once, so there is no problem.
            // TODO: handle certain side effects when possible in select
            bool validEffects = std::is_same<T, If>::value ||
                                !ShallowEffectAnalyzer(
                                   getPassOptions(), *getModule(), curr->ifTrue)
                                   .hasSideEffects();

            // In addition, check for specific limitations of select.
            bool validChildren =
              !std::is_same<T, Select>::value ||
              Properties::canEmitSelectWithArms(ifTrueChild, ifFalseChild);

            if (validTypes && validEffects && validChildren) {
              // Replace ifTrue with its child.
              curr->ifTrue = ifTrueChild;
              // Relace ifFalse with its child, and reuse that node outside.
              auto* reuse = curr->ifFalse;
              curr->ifFalse = ifFalseChild;
              // curr's type may have changed, if the instructions we moved out
              // had different input types than output types.
              curr->finalize();
              // Point to curr from the code that is now outside of it.
              *ChildIterator(reuse).begin() = curr;
              if (!chain.empty()) {
                // We've already moved things out, so chain them to there. That
                // is, the end of the chain should now point to reuse (which
                // in turn already points to curr).
                *ChildIterator(chain.back()).begin() = reuse;
              }
              chain.push_back(reuse);
              continue;
            }
          }
        }
        break;
      }
      if (!chain.empty()) {
        // The beginning of the chain is the new top parent.
        return replaceCurrent(chain[0]);
      }
    }
  }